

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O0

void phyr::ParallelFor(function<void_(long)> *func,int64_t count,int chunkSize)

{
  bool bVar1;
  long *plVar2;
  int in_EDX;
  long in_RSI;
  int64_t index;
  int64_t indexEnd;
  int64_t indexStart;
  unique_lock<std::mutex> lock;
  ParallelForLoop loop;
  int64_t i;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  Point2<int> in_stack_fffffffffffffee0;
  function<void_(long)> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  Point2<int> local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  ParallelForLoop local_90;
  long local_20;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  bVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::empty
                    ((vector<std::thread,_std::allocator<std::thread>_> *)
                     CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  if ((bVar1) || (local_10 < local_14)) {
    for (local_20 = 0; local_20 < local_10; local_20 = local_20 + 1) {
      std::function<void_(long)>::operator()
                ((function<void_(long)> *)in_stack_fffffffffffffee0,
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
  }
  else {
    std::function<void_(long)>::function
              ((function<void_(long)> *)in_stack_fffffffffffffee0,
               (function<void_(long)> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    ParallelForLoop::ParallelForLoop
              ((ParallelForLoop *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,(int64_t)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc);
    std::function<void_(long)>::~function((function<void_(long)> *)0x187154);
    std::mutex::lock((mutex *)in_stack_fffffffffffffee0);
    local_90.next = workList;
    workList = &local_90;
    std::mutex::unlock((mutex *)0x18718c);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffee0,
               (mutex_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::condition_variable::notify_all();
    while (bVar1 = ParallelForLoop::finished(&local_90), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_d8 = local_90.nextIndex;
      local_e8 = local_90.nextIndex + local_90.chunkSize;
      plVar2 = std::min<long>(&local_e8,&local_90.maxIndex);
      local_e0 = *plVar2;
      if (local_e0 == local_90.maxIndex) {
        workList = local_90.next;
      }
      local_90.activeWorkers = local_90.activeWorkers + 1;
      local_90.nextIndex = local_e0;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffee0);
      for (local_f0 = local_d8; local_f0 < local_e0; local_f0 = local_f0 + 1) {
        bVar1 = std::function::operator_cast_to_bool((function<void_(long)> *)0x1872d7);
        if (bVar1) {
          std::function<void_(long)>::operator()
                    ((function<void_(long)> *)in_stack_fffffffffffffee0,
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        }
        else {
          in_stack_fffffffffffffee0 = (Point2<int>)&local_90.func2D;
          Point2<int>::Point2(&local_f8,(int)(local_f0 % (long)local_90.nX),
                              (int)(local_f0 / (long)local_90.nX));
          std::function<void_(phyr::Point2<int>)>::operator()
                    ((function<void_(phyr::Point2<int>)> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     in_stack_fffffffffffffee0);
        }
      }
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_stack_fffffffffffffee0);
      local_90.activeWorkers = local_90.activeWorkers + -1;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffee0)
    ;
    ParallelForLoop::~ParallelForLoop((ParallelForLoop *)in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void ParallelFor(std::function<void(int64_t)> func, int64_t count, int chunkSize) {
    ASSERT(threads.size() > 0 || maxThreadIndex() == 1);

    // Run iterations immediately if not using threads or if _count_ is small
    if (threads.empty() || count < chunkSize) {
        for (int64_t i = 0; i < count; ++i) func(i);
        return;
    }

    // Create and enqueue _ParallelForLoop_ for this loop
    ParallelForLoop loop(std::move(func), count, chunkSize);
    workListMutex.lock();
    loop.next = workList;
    workList = &loop;
    workListMutex.unlock();

    // Notify worker threads of work to be done
    std::unique_lock<std::mutex> lock(workListMutex);
    workListCondition.notify_all();

    // Help out with parallel loop iterations in the current thread
    while (!loop.finished()) {
        // Run a chunk of loop iterations for _loop_

        // Find the set of loop iterations to run next
        int64_t indexStart = loop.nextIndex;
        int64_t indexEnd = std::min(indexStart + loop.chunkSize, loop.maxIndex);

        // Update _loop_ to reflect iterations this thread will run
        loop.nextIndex = indexEnd;
        if (loop.nextIndex == loop.maxIndex) workList = loop.next;
        loop.activeWorkers++;

        // Run loop indices in _[indexStart, indexEnd)_
        lock.unlock();
        for (int64_t index = indexStart; index < indexEnd; ++index) {
            if (loop.func1D) {
                loop.func1D(index);
            }
            // Handle other types of loops
            else {
                ASSERT(loop.func2D);
                loop.func2D(Point2i(index % loop.nX, index / loop.nX));
            }
        }
        lock.lock();

        // Update _loop_ to reflect completion of iterations
        loop.activeWorkers--;
    }
}